

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O1

DecimalFormatSymbols * __thiscall
icu_63::DecimalFormatSymbols::operator=(DecimalFormatSymbols *this,DecimalFormatSymbols *rhs)

{
  UnicodeString *this_00;
  long lVar1;
  UnicodeString *src;
  
  if (this != rhs) {
    lVar1 = 8;
    do {
      UnicodeString::fastCopyFrom
                ((UnicodeString *)((long)&(this->super_UObject)._vptr_UObject + lVar1),
                 (UnicodeString *)((long)&(rhs->super_UObject)._vptr_UObject + lVar1));
      lVar1 = lVar1 + 0x40;
    } while (lVar1 != 0x708);
    this_00 = (UnicodeString *)&this->field_0xa38;
    src = (UnicodeString *)&rhs->field_0xa38;
    lVar1 = 3;
    do {
      UnicodeString::fastCopyFrom(this_00 + -3,src + -3);
      UnicodeString::fastCopyFrom(this_00,src);
      src = src + 1;
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    Locale::operator=(&this->locale,&rhs->locale);
    strcpy(this->validLocale,rhs->validLocale);
    strcpy(this->actualLocale,rhs->actualLocale);
    this->fIsCustomCurrencySymbol = rhs->fIsCustomCurrencySymbol;
    this->fIsCustomIntlCurrencySymbol = rhs->fIsCustomIntlCurrencySymbol;
    this->fCodePointZero = rhs->fCodePointZero;
  }
  return this;
}

Assistant:

DecimalFormatSymbols&
DecimalFormatSymbols::operator=(const DecimalFormatSymbols& rhs)
{
    if (this != &rhs) {
        for(int32_t i = 0; i < (int32_t)kFormatSymbolCount; ++i) {
            // fastCopyFrom is safe, see docs on fSymbols
            fSymbols[(ENumberFormatSymbol)i].fastCopyFrom(rhs.fSymbols[(ENumberFormatSymbol)i]);
        }
        for(int32_t i = 0; i < (int32_t)UNUM_CURRENCY_SPACING_COUNT; ++i) {
            currencySpcBeforeSym[i].fastCopyFrom(rhs.currencySpcBeforeSym[i]);
            currencySpcAfterSym[i].fastCopyFrom(rhs.currencySpcAfterSym[i]);
        }
        locale = rhs.locale;
        uprv_strcpy(validLocale, rhs.validLocale);
        uprv_strcpy(actualLocale, rhs.actualLocale);
        fIsCustomCurrencySymbol = rhs.fIsCustomCurrencySymbol; 
        fIsCustomIntlCurrencySymbol = rhs.fIsCustomIntlCurrencySymbol; 
        fCodePointZero = rhs.fCodePointZero;
    }
    return *this;
}